

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int stbtt__close_shape(nk_tt_vertex *vertices,int num_vertices,int was_off,int start_off,nk_int sx,
                      nk_int sy,nk_int scx,nk_int scy,nk_int cx,nk_int cy)

{
  nk_tt_vertex *pnVar1;
  short sVar2;
  short sVar3;
  long lVar4;
  
  sVar2 = (short)sx;
  sVar3 = (short)sy;
  if (start_off == 0) {
    lVar4 = (long)num_vertices;
    pnVar1 = vertices + lVar4;
    if (was_off == 0) {
      pnVar1->type = '\x02';
      pnVar1->x = sVar2;
      pnVar1->y = sVar3;
      pnVar1->cx = 0;
      scy = 0;
    }
    else {
      pnVar1->type = '\x03';
      pnVar1->x = sVar2;
      pnVar1->y = sVar3;
      pnVar1->cx = (short)cx;
      scy = cy;
    }
  }
  else {
    if (was_off != 0) {
      vertices[num_vertices].type = '\x03';
      vertices[num_vertices].x = (short)((uint)(cx + scx) >> 1);
      vertices[num_vertices].y = (short)((uint)(cy + scy) >> 1);
      vertices[num_vertices].cx = (short)cx;
      vertices[num_vertices].cy = (short)cy;
      num_vertices = num_vertices + 1;
    }
    lVar4 = (long)num_vertices;
    vertices[lVar4].type = '\x03';
    vertices[lVar4].x = sVar2;
    vertices[lVar4].y = sVar3;
    vertices[lVar4].cx = (short)scx;
  }
  vertices[lVar4].cy = (short)scy;
  return num_vertices + 1;
}

Assistant:

NK_INTERN int
stbtt__close_shape(struct nk_tt_vertex *vertices, int num_vertices, int was_off,
    int start_off, nk_int sx, nk_int sy, nk_int scx, nk_int scy, nk_int cx, nk_int cy)
{
   if (start_off) {
      if (was_off)
         nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vcurve, (cx+scx)>>1, (cy+scy)>>1, cx,cy);
      nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vcurve, sx,sy,scx,scy);
   } else {
      if (was_off)
         nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vcurve,sx,sy,cx,cy);
      else
         nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vline,sx,sy,0,0);
   }
   return num_vertices;
}